

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O0

void __thiscall
QFontFamilyDelegate::QFontFamilyDelegate
          (QFontFamilyDelegate *this,QObject *parent,QFontComboBoxPrivate *comboP)

{
  undefined8 in_RDX;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  char16_t *str_1;
  DataPointer *in_stack_ffffffffffffff08;
  QArrayDataPointer<char16_t> *this_00;
  QObject *in_stack_ffffffffffffff18;
  QString *pQVar1;
  QAbstractItemDelegate *in_stack_ffffffffffffff20;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_50 [24];
  QArrayDataPointer<char16_t> local_38;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemDelegate::QAbstractItemDelegate(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *in_RDI = &PTR_metaObject_00d13c00;
  this_00 = (QArrayDataPointer<char16_t> *)(in_RDI + 2);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&local_38,(Data *)0x0,L":/qt-project.org/styles/commonstyle/images/fonttruetype-16.png"
             ,0x3e);
  pQVar1 = (QString *)local_20;
  QString::QString((QString *)this_00,in_stack_ffffffffffffff08);
  QIcon::QIcon((QIcon *)this_00,pQVar1);
  QString::~QString((QString *)0x598797);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&local_68,(Data *)0x0,L":/qt-project.org/styles/commonstyle/images/fontbitmap-16.png",
             0x3c);
  QString::QString((QString *)this_00,in_stack_ffffffffffffff08);
  QIcon::QIcon((QIcon *)(in_RDI + 3),(QString *)local_50);
  QString::~QString((QString *)0x598824);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  *(undefined4 *)(in_RDI + 4) = 0;
  in_RDI[5] = in_RDX;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFontFamilyDelegate::QFontFamilyDelegate(QObject *parent, QFontComboBoxPrivate *comboP)
    : QAbstractItemDelegate(parent),
      truetype(QStringLiteral(":/qt-project.org/styles/commonstyle/images/fonttruetype-16.png")),
      bitmap(QStringLiteral(":/qt-project.org/styles/commonstyle/images/fontbitmap-16.png")),
      writingSystem(QFontDatabase::Any),
      comboPrivate(comboP)
{
}